

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.c
# Opt level: O1

int stlstp_(double *y,int *n,int *np,int *ns,int *nt,int *nl,int *isdeg,int *itdeg,int *ildeg,
           int *nsjump,int *ntjump,int *nljump,int *ni,int *userw,double *rw,double *season,
           double *trend,double *work)

{
  uint uVar1;
  int iVar2;
  double *y_00;
  int *np_00;
  uint *n_00;
  int iVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  bool bVar7;
  int local_5c;
  int local_58;
  int c_false;
  double *local_50;
  int *local_48;
  uint *local_40;
  uint local_34 [2];
  int i__2;
  
  local_5c = 0;
  local_58 = *ni;
  if (0 < local_58) {
    uVar1 = *n + *np * 2;
    c_false = *n * 2 + *np * 4 + 1;
    lVar4 = (long)(int)uVar1;
    lVar5 = (long)(int)~uVar1;
    local_50 = work + lVar5 + (long)(int)(uVar1 * 3) + 1;
    local_48 = np;
    local_40 = (uint *)n;
    iVar3 = 1;
    do {
      np_00 = local_48;
      local_34[0] = *local_40;
      if (0 < (int)local_34[0]) {
        uVar6 = 0;
        do {
          work[lVar5 + lVar4 + uVar6 + 1] = y[uVar6] - trend[uVar6];
          uVar6 = uVar6 + 1;
        } while (local_34[0] != uVar6);
      }
      stlss_(work,(int *)local_40,local_48,ns,isdeg,nsjump,userw,rw,
             work + lVar5 + (int)(uVar1 * 2 + 1),local_50,work + lVar5 + (int)(uVar1 * 4 + 1),
             work + lVar5 + (long)(int)(uVar1 * 5) + 1,season);
      n_00 = local_40;
      y_00 = local_50;
      local_34[0] = *np_00 * 2 + *local_40;
      stlfts_(work + lVar5 + (int)(uVar1 * 2 + 1),(int *)local_34,np_00,local_50,work);
      stless_(y_00,(int *)n_00,nl,ildeg,nljump,&local_5c,work + lVar5 + (int)(uVar1 * 4 + 1),work,
              work + lVar5 + (long)(int)(uVar1 * 5) + 1);
      local_34[0] = *n_00;
      if (0 < (int)local_34[0]) {
        iVar2 = *local_48;
        uVar6 = 0;
        do {
          season[uVar6] =
               work[lVar5 + (iVar2 + c_false + (int)uVar6)] - work[lVar5 + lVar4 + uVar6 + 1];
          uVar6 = uVar6 + 1;
        } while (local_34[0] != uVar6);
      }
      if (0 < (int)local_34[0]) {
        uVar6 = 0;
        do {
          work[lVar5 + lVar4 + uVar6 + 1] = y[uVar6] - season[uVar6];
          uVar6 = uVar6 + 1;
        } while (local_34[0] != uVar6);
      }
      stless_(work,(int *)local_40,nt,itdeg,ntjump,userw,rw,trend,local_50);
      bVar7 = iVar3 != local_58;
      iVar3 = iVar3 + 1;
    } while (bVar7);
  }
  return 0;
}

Assistant:

int stlstp_(double *y, int *n, int *np, int *ns, int *nt, int *nl, int *isdeg, int *itdeg, int 
	*ildeg, int *nsjump, int *ntjump, int *nljump, int *ni, int *userw, double *rw, double *season,
	double *trend, double *work)
{
    /* System generated locals */
    int work_dim1, work_offset, i__1, i__2;

    /* Local variables */
    int i__, j;
	int c_false = 0;

/* Arg */
/* Var */
    /* Parameter adjustments */
    --trend;
    --season;
    --rw;
    --y;
    work_dim1 = *n + 2 * *np;
    work_offset = 1 + work_dim1;
    work -= work_offset;

    /* Function Body */
    i__1 = *ni;
    for (j = 1; j <= i__1; ++j) {
	i__2 = *n;
	for (i__ = 1; i__ <= i__2; ++i__) {
	    work[i__ + work_dim1] = y[i__] - trend[i__];
/* L1: */
	}
	stlss_(&work[work_dim1 + 1], n, np, ns, isdeg, nsjump, userw, &rw[1], 
		&work[(work_dim1 << 1) + 1], &work[work_dim1 * 3 + 1], &work[(
		work_dim1 << 2) + 1], &work[work_dim1 * 5 + 1], &season[1]);
	i__2 = *n + (*np << 1);
	stlfts_(&work[(work_dim1 << 1) + 1], &i__2, np, &work[work_dim1 * 3 + 
		1], &work[work_dim1 + 1]);
	stless_(&work[work_dim1 * 3 + 1], n, nl, ildeg, nljump, &c_false, &
		work[(work_dim1 << 2) + 1], &work[work_dim1 + 1], &work[
		work_dim1 * 5 + 1]);
	i__2 = *n;
	for (i__ = 1; i__ <= i__2; ++i__) {
	    season[i__] = work[*np + i__ + (work_dim1 << 1)] - work[i__ + 
		    work_dim1];
/* L3: */
	}
	i__2 = *n;
	for (i__ = 1; i__ <= i__2; ++i__) {
	    work[i__ + work_dim1] = y[i__] - season[i__];
/* L5: */
	}
	stless_(&work[work_dim1 + 1], n, nt, itdeg, ntjump, userw, &rw[1], &
		trend[1], &work[work_dim1 * 3 + 1]);
/* L80: */
    }
    return 0;
}